

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

int amqp_tcp_socket_close(void *base)

{
  int iVar1;
  long in_RDI;
  amqp_tcp_socket_t *self;
  
  if (*(int *)(in_RDI + 8) != -1) {
    iVar1 = amqp_os_socket_close(0);
    if (iVar1 != 0) {
      return -9;
    }
    *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  }
  return 0;
}

Assistant:

static int
amqp_tcp_socket_close(void *base)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;

  if (-1 != self->sockfd) {
    if (amqp_os_socket_close(self->sockfd)) {
      return AMQP_STATUS_SOCKET_ERROR;
    }
    self->sockfd = -1;
  }

  return AMQP_STATUS_OK;
}